

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::aux::bt_peer_connection::on_connected(bt_peer_connection *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  byte bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  session_settings *psVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar9;
  element_type *peVar10;
  bool bVar11;
  cork c_;
  cork local_40;
  undefined1 local_30 [8];
  mutex_type *local_28;
  undefined4 extraout_var;
  
  local_28 = (mutex_type *)local_30;
  iVar6 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if ((char)iVar6 != '\0') {
    return;
  }
  peVar10 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_00 = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar6 = p_Var4->_M_use_count;
      do {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar6 == 0) break;
        LOCK();
        iVar2 = p_Var4->_M_use_count;
        bVar11 = iVar6 == iVar2;
        if (bVar11) {
          p_Var4->_M_use_count = iVar6 + 1;
          iVar2 = iVar6;
        }
        iVar6 = iVar2;
        UNLOCK();
        this_00 = p_Var4;
      } while (!bVar11);
    }
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar10 = (element_type *)0x0;
  }
  else if (this_00->_M_use_count == 0) {
    peVar10 = (element_type *)0x0;
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
    }
  }
  if (((peVar10->super_torrent_hot_members).field_0x4b & 0x80) != 0) {
    peer_connection::peer_log(&this->super_peer_connection,info,"ON_CONNECTED","graceful-paused");
    _local_30 = errors::make_error_code(torrent_paused);
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,local_30,1,0);
    goto LAB_0018a3b8;
  }
  bVar3 = (this->super_peer_connection).m_channel_state.
          super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
          ._M_elems[0].m_val;
  local_40.m_need_uncork = (bVar3 & 4) == 0;
  if (local_40.m_need_uncork) {
    (this->super_peer_connection).m_channel_state.
    super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
    ._M_elems[0].m_val = bVar3 | 4;
  }
  psVar5 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
  local_28._0_1_ = false;
  local_30 = (undefined1  [8])&psVar5->m_mutex;
  local_40.m_pc = &this->super_peer_connection;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
  local_28._0_1_ = true;
  uVar9 = (uint)(byte)(psVar5->m_store).m_ints._M_elems[0x76];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  bVar11 = is_ssl(&(this->super_peer_connection).m_socket);
  if (bVar11) {
    uVar9 = 2;
  }
  uVar7 = 3;
  if (uVar9 < 3) {
    uVar7 = (ulong)uVar9;
  }
  peer_connection::peer_log
            (&this->super_peer_connection,info,"ENCRYPTION","outgoing encryption policy: %s",
             _ZZN10libtorrent3aux18bt_peer_connection12on_connectedEvE11policy_name_rel +
             *(int *)(_ZZN10libtorrent3aux18bt_peer_connection12on_connectedEvE11policy_name_rel +
                     uVar7 * 4));
  if (uVar9 == 0) {
    write_pe1_2_dhkey(this);
    iVar6 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])(this);
    if ((char)iVar6 == '\0') {
      (this->super_peer_connection).field_0x888 = 0;
      iVar6 = 0x60;
      goto LAB_0018a348;
    }
  }
  else if (uVar9 == 1) {
    iVar6 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
    lVar8 = CONCAT44(extraout_var,iVar6);
    uVar9 = *(uint *)(lVar8 + 0x1b);
    if ((uVar9 >> 0x17 & 1) == 0) {
      *(uint *)(lVar8 + 0x1b) = uVar9 | 0x800000;
      iVar6 = 0x14;
      write_handshake(this);
    }
    else {
      *(uint *)(lVar8 + 0x1b) = uVar9 & 0xff7fffff;
      peer_connection::fast_reconnect(&this->super_peer_connection,true);
      write_pe1_2_dhkey(this);
      iVar6 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])
                        (this);
      if ((char)iVar6 != '\0') goto LAB_0018a3ae;
      (this->super_peer_connection).field_0x888 = 0;
      iVar6 = 0x60;
    }
    crypto_receive_buffer::reset(&this->m_recv_buffer,iVar6);
    peer_connection::setup_receive(&this->super_peer_connection);
  }
  else {
    iVar6 = 0x14;
    write_handshake(this);
LAB_0018a348:
    crypto_receive_buffer::reset(&this->m_recv_buffer,iVar6);
    peer_connection::setup_receive(&this->super_peer_connection);
  }
LAB_0018a3ae:
  cork::~cork(&local_40);
LAB_0018a3b8:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void bt_peer_connection::on_connected()
	{
		if (is_disconnecting()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		if (t->graceful_pause())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "ON_CONNECTED", "graceful-paused");
#endif
			disconnect(errors::torrent_paused, operation_t::bittorrent);
			return;
		}

		// make sure are much as possible of the response ends up in the same
		// packet, or at least back-to-back packets
		cork c_(*this);

#if !defined TORRENT_DISABLE_ENCRYPTION

		auto out_policy = static_cast<std::uint8_t>(m_settings.get_int(settings_pack::out_enc_policy));

#ifdef TORRENT_SSL_PEERS
		// never try an encrypted connection when already using SSL
		if (is_ssl(get_socket()))
			out_policy = settings_pack::pe_disabled;
#endif
#if TORRENT_USE_RTC
		// never try an encrypted connection over WebRTC (which is already encrypted)
		if (torrent_peer *pi = peer_info_struct())
			if (pi->is_rtc_addr)
				out_policy = settings_pack::pe_disabled;
#endif
#ifndef TORRENT_DISABLE_LOGGING
		static char const* policy_name[] = {"forced", "enabled", "disabled", "invalid-setting"};
		int const policy_name_idx = out_policy > 3 ? 3 : out_policy;
		peer_log(peer_log_alert::info, "ENCRYPTION"
			, "outgoing encryption policy: %s", policy_name[policy_name_idx]);
#endif

		if (out_policy == settings_pack::pe_forced)
		{
			write_pe1_2_dhkey();
			if (is_disconnecting()) return;

			m_state = state_t::read_pe_dhkey;
			m_recv_buffer.reset(dh_key_len);
			setup_receive();
		}
		else if (out_policy == settings_pack::pe_enabled)
		{
			TORRENT_ASSERT(peer_info_struct());

			torrent_peer* pi = peer_info_struct();
			if (pi->pe_support == true)
			{
				// toggle encryption support flag, toggled back to
				// true if encrypted portion of the handshake
				// completes correctly
				pi->pe_support = false;

				// if this fails, we need to reconnect
				// fast.
				fast_reconnect(true);

				write_pe1_2_dhkey();
				if (is_disconnecting()) return;
				m_state = state_t::read_pe_dhkey;
				m_recv_buffer.reset(dh_key_len);
				setup_receive();
			}
			else // pi->pe_support == false
			{
				// toggled back to false if standard handshake
				// completes correctly (without encryption)
				pi->pe_support = true;

				write_handshake();
				m_recv_buffer.reset(20);
				setup_receive();
			}
		}
		else
#endif
		{
#if !defined TORRENT_DISABLE_ENCRYPTION
			TORRENT_ASSERT(out_policy == settings_pack::pe_disabled);
#endif
			write_handshake();

			TORRENT_ASSERT(m_sent_handshake);
			// start in the state where we are trying to read the
			// handshake from the other side
			m_recv_buffer.reset(20);
			setup_receive();
		}
	}